

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_read_support_format_rar.c
# Opt level: O0

int run_filters(archive_read *a)

{
  uint uVar1;
  void *pvVar2;
  rar_filter *prVar3;
  long startpos;
  int iVar4;
  long *plVar5;
  ulong uVar6;
  void *pvVar7;
  bool bVar8;
  uint local_48;
  int ret;
  uint32_t lastfilterlength;
  uint32_t lastfilteraddress;
  size_t end;
  size_t start;
  rar_filter *filter;
  rar_filters *filters;
  rar *rar;
  archive_read *a_local;
  
  pvVar2 = a->format->data;
  plVar5 = (long *)((long)pvVar2 + 0x390);
  prVar3 = *(rar_filter **)((long)pvVar2 + 0x3a0);
  startpos = *(long *)((long)pvVar2 + 0x3a8);
  uVar1 = prVar3->blocklength;
  *(undefined8 *)((long)pvVar2 + 0x3a8) = 0x7fffffffffffffff;
  uVar6 = expand(a,startpos + (ulong)uVar1);
  if (uVar6 == startpos + (ulong)prVar3->blocklength) {
    if (*plVar5 == 0) {
      pvVar7 = calloc(1,0x40024);
      *plVar5 = (long)pvVar7;
      if (*plVar5 == 0) {
        return 0;
      }
    }
    iVar4 = copy_from_lzss_window(a,(void *)(*plVar5 + 0x20),startpos,prVar3->blocklength);
    if ((iVar4 == 0) &&
       (iVar4 = execute_filter(a,prVar3,(rar_virtual_machine *)*plVar5,
                               *(size_t *)((long)pvVar2 + 0xb8)), iVar4 != 0)) {
      ret = prVar3->filteredblockaddress;
      local_48 = prVar3->filteredblocklength;
      *(rar_filter **)((long)pvVar2 + 0x3a0) = prVar3->next;
      prVar3->next = (rar_filter *)0x0;
      delete_filter(prVar3);
      while( true ) {
        prVar3 = *(rar_filter **)((long)pvVar2 + 0x3a0);
        bVar8 = false;
        if ((prVar3 != (rar_filter *)0x0) &&
           (bVar8 = false, prVar3->blockstartpos == *(size_t *)((long)pvVar2 + 0x3a8))) {
          bVar8 = prVar3->blocklength == local_48;
        }
        if (!bVar8) {
          if (*(long *)((long)pvVar2 + 0x3a0) != 0) {
            if (*(ulong *)(*(long *)((long)pvVar2 + 0x3a0) + 0x38) < uVar6) {
              return 0;
            }
            *(undefined8 *)((long)pvVar2 + 0x3a8) =
                 *(undefined8 *)(*(long *)((long)pvVar2 + 0x3a0) + 0x38);
          }
          *(ulong *)((long)pvVar2 + 0x3b8) = uVar6;
          *(ulong *)((long)pvVar2 + 0x3c0) = *plVar5 + 0x20 + (ulong)(uint)ret;
          *(ulong *)((long)pvVar2 + 0x3c8) = (ulong)local_48;
          return 1;
        }
        memmove((void *)(*plVar5 + 0x20),(void *)(*plVar5 + 0x20 + (ulong)(uint)ret),(ulong)local_48
               );
        iVar4 = execute_filter(a,prVar3,(rar_virtual_machine *)*plVar5,
                               *(size_t *)((long)pvVar2 + 0xb8));
        if (iVar4 == 0) break;
        ret = prVar3->filteredblockaddress;
        local_48 = prVar3->filteredblocklength;
        *(rar_filter **)((long)pvVar2 + 0x3a0) = prVar3->next;
        prVar3->next = (rar_filter *)0x0;
        delete_filter(prVar3);
      }
    }
  }
  return 0;
}

Assistant:

static int
run_filters(struct archive_read *a)
{
  struct rar *rar = (struct rar *)(a->format->data);
  struct rar_filters *filters = &rar->filters;
  struct rar_filter *filter = filters->stack;
  size_t start = filters->filterstart;
  size_t end = start + filter->blocklength;
  uint32_t lastfilteraddress;
  uint32_t lastfilterlength;
  int ret;

  filters->filterstart = INT64_MAX;
  end = (size_t)expand(a, end);
  if (end != start + filter->blocklength)
    return 0;

  if (!filters->vm)
  {
    filters->vm = calloc(1, sizeof(*filters->vm));
    if (!filters->vm)
      return 0;
  }

  ret = copy_from_lzss_window(a, filters->vm->memory, start, filter->blocklength);
  if (ret != ARCHIVE_OK)
    return 0;
  if (!execute_filter(a, filter, filters->vm, rar->offset))
    return 0;

  lastfilteraddress = filter->filteredblockaddress;
  lastfilterlength = filter->filteredblocklength;
  filters->stack = filter->next;
  filter->next = NULL;
  delete_filter(filter);

  while ((filter = filters->stack) != NULL && (int64_t)filter->blockstartpos == filters->filterstart && filter->blocklength == lastfilterlength)
  {
    memmove(&filters->vm->memory[0], &filters->vm->memory[lastfilteraddress], lastfilterlength);
    if (!execute_filter(a, filter, filters->vm, rar->offset))
      return 0;

    lastfilteraddress = filter->filteredblockaddress;
    lastfilterlength = filter->filteredblocklength;
    filters->stack = filter->next;
    filter->next = NULL;
    delete_filter(filter);
  }

  if (filters->stack)
  {
    if (filters->stack->blockstartpos < end)
      return 0;
    filters->filterstart = filters->stack->blockstartpos;
  }

  filters->lastend = end;
  filters->bytes = &filters->vm->memory[lastfilteraddress];
  filters->bytes_ready = lastfilterlength;

  return 1;
}